

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

unique_ptr<interfaces::Node,_std::default_delete<interfaces::Node>_> __thiscall
interfaces::MakeNode(interfaces *this,NodeContext *context)

{
  long lVar1;
  undefined8 *puVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = (undefined8 *)operator_new(0x10);
  *puVar2 = &PTR__Node_00b240c0;
  puVar2[1] = context;
  *(undefined8 **)this = puVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (__uniq_ptr_data<interfaces::Node,_std::default_delete<interfaces::Node>,_true,_true>)
           (__uniq_ptr_data<interfaces::Node,_std::default_delete<interfaces::Node>,_true,_true>)
           this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Node> MakeNode(node::NodeContext& context) { return std::make_unique<node::NodeImpl>(context); }